

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseAssertTrapCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  Command *pCVar2;
  bool bVar3;
  Result RVar4;
  Command *local_30;
  
  pCVar2 = local_30;
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  RVar4 = Expect(this,AssertTrap);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  bVar3 = PeekMatchLpar(this,Module);
  if (bVar3) {
    MakeUnique<wabt::AssertModuleCommand<(wabt::CommandType)6>>();
    RVar4 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                    *)(local_30 + 1));
    if (RVar4.enum_ == Error) goto LAB_00dabd31;
    RVar4 = ParseQuotedText(this,(string *)&local_30[1].type);
LAB_00dabd2c:
    if (RVar4.enum_ == Error) goto LAB_00dabd31;
    local_30 = (Command *)0x0;
    pCVar1 = (out_command->_M_t).
             super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
             super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar2;
    if (pCVar1 == (Command *)0x0) goto LAB_00dabd48;
    (*pCVar1->_vptr_Command[1])();
    bVar3 = true;
  }
  else {
    MakeUnique<wabt::AssertTrapCommandBase<(wabt::CommandType)10>>();
    RVar4 = ParseAction(this,(ActionPtr *)(local_30 + 1));
    if (RVar4.enum_ != Error) {
      RVar4 = ParseQuotedText(this,(string *)&local_30[1].type);
      goto LAB_00dabd2c;
    }
LAB_00dabd31:
    bVar3 = false;
  }
  if (local_30 != (Command *)0x0) {
    (*local_30->_vptr_Command[1])();
  }
  if (!bVar3) {
    return (Result)Error;
  }
LAB_00dabd48:
  RVar4 = Expect(this,Rpar);
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

Result WastParser::ParseAssertTrapCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseAssertTrapCommand);
  EXPECT(Lpar);
  EXPECT(AssertTrap);
  if (PeekMatchLpar(TokenType::Module)) {
    auto command = MakeUnique<AssertUninstantiableCommand>();
    CHECK_RESULT(ParseScriptModule(&command->module));
    CHECK_RESULT(ParseQuotedText(&command->text));
    *out_command = std::move(command);
  } else {
    auto command = MakeUnique<AssertTrapCommand>();
    CHECK_RESULT(ParseAction(&command->action));
    CHECK_RESULT(ParseQuotedText(&command->text));
    *out_command = std::move(command);
  }
  EXPECT(Rpar);
  return Result::Ok;
}